

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

int cimg_library::cimg::fread<long>(long *ptr,uint nmemb,FILE *stream)

{
  int iVar1;
  size_t sVar2;
  CImgArgumentException *this;
  uint uVar3;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  size_t __n;
  ulong uVar4;
  
  uVar4 = (ulong)nmemb;
  if (((ptr != (long *)0x0) && (nmemb != 0)) && (stream != (FILE *)0x0)) {
    uVar6 = 0;
    do {
      __n = 0x7e0000;
      if ((uint)uVar4 < 0x7e0000) {
        __n = uVar4;
      }
      sVar2 = fread(ptr + uVar6,8,__n,(FILE *)stream);
      iVar1 = (int)sVar2;
      uVar5 = (int)uVar6 + iVar1;
      uVar6 = (ulong)uVar5;
      uVar3 = (uint)uVar4 - iVar1;
      uVar4 = (ulong)uVar3;
    } while (((int)__n == iVar1) && (uVar3 != 0));
    if (uVar3 != 0) {
      warn("cimg::fread() : Only %u/%u elements could be read from file.",uVar6,(ulong)nmemb);
    }
    return uVar5;
  }
  this = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
  pcVar7 = "";
  if (1 < nmemb) {
    pcVar7 = "s";
  }
  CImgArgumentException::CImgArgumentException
            (this,"cimg::fread() : Invalid reading request of %u %s%s from file %p to buffer %p.",
             uVar4,"long",pcVar7,stream,ptr);
  __cxa_throw(this,&CImgArgumentException::typeinfo,std::exception::~exception);
}

Assistant:

inline int fread(T *const ptr, const unsigned int nmemb, std::FILE *stream) {
      if (!ptr || nmemb<=0 || !stream)
        throw CImgArgumentException("cimg::fread() : Invalid reading request of %u %s%s from file %p to buffer %p.",
                                    nmemb,cimg::type<T>::string(),nmemb>1?"s":"",stream,ptr);

      const unsigned long wlimitT = 63*1024*1024, wlimit = wlimitT/sizeof(T);
      unsigned int to_read = nmemb, al_read = 0, l_to_read = 0, l_al_read = 0;
      do {
        l_to_read = (to_read*sizeof(T))<wlimitT?to_read:wlimit;
        l_al_read = (unsigned int)std::fread((void*)(ptr+al_read),sizeof(T),l_to_read,stream);
        al_read+=l_al_read;
        to_read-=l_al_read;
      } while (l_to_read==l_al_read && to_read>0);
      if (to_read>0)
        warn("cimg::fread() : Only %u/%u elements could be read from file.",
             al_read,nmemb);
      return al_read;
    }